

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

BOOL QueryPerformanceCounter(LARGE_INTEGER *lpPerformanceCount)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_28 [8];
  timespec ts;
  BOOL retval;
  LARGE_INTEGER *lpPerformanceCount_local;
  
  ts.tv_nsec._4_4_ = 1;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar2 = clock_gettime(1,(timespec *)local_28);
  if (iVar2 == 0) {
    lpPerformanceCount->QuadPart = (long)local_28 * 1000000000 + ts.tv_sec;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","QueryPerformanceCounter",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/time.cpp"
            ,0xd6);
    __stream = _stderr;
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"clock_gettime(CLOCK_MONOTONIC) failed; errno is %d (%s)\n",(ulong)uVar1,pcVar5
           );
    ts.tv_nsec._4_4_ = 0;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return ts.tv_nsec._4_4_;
}

Assistant:

BOOL
PALAPI
QueryPerformanceCounter(
    OUT LARGE_INTEGER *lpPerformanceCount
    )
{
    BOOL retval = TRUE;

    PERF_ENTRY(QueryPerformanceCounter);
    ENTRY("QueryPerformanceCounter()\n");
    do
#if HAVE_CLOCK_MONOTONIC
    {
        struct timespec ts;
        if (clock_gettime(CLOCK_MONOTONIC, &ts) != 0)
        {
            ASSERT("clock_gettime(CLOCK_MONOTONIC) failed; errno is %d (%s)\n", errno, strerror(errno));
            retval = FALSE;
            break;
        }
        lpPerformanceCount->QuadPart =
            (LONGLONG)ts.tv_sec * (LONGLONG)tccSecondsToNanoSeconds + (LONGLONG)ts.tv_nsec;
    }
#elif HAVE_MACH_ABSOLUTE_TIME
    {
        lpPerformanceCount->QuadPart = (LONGLONG)mach_absolute_time();
    }
#elif HAVE_GETHRTIME
    {
        lpPerformanceCount->QuadPart = (LONGLONG)gethrtime();
    }
#elif HAVE_READ_REAL_TIME
    {
        timebasestruct_t tb;
        read_real_time(&tb, TIMEBASE_SZ);
        if (time_base_to_time(&tb, TIMEBASE_SZ) != 0)
        {
            ASSERT("time_base_to_time() failed; errno is %d (%s)\n", errno, strerror(errno));
            retval = FALSE;
            break;
        }
        lpPerformanceCount->QuadPart =
            (LONGLONG)tb.tb_high * (LONGLONG)tccSecondsToNanoSeconds + (LONGLONG)tb.tb_low;
    }
#else
    {
        struct timeval tv;
        if (gettimeofday(&tv, NULL) == -1)
        {
            ASSERT("gettimeofday() failed; errno is %d (%s)\n", errno, strerror(errno));
            retval = FALSE;
            break;
        }
        lpPerformanceCount->QuadPart =
            (LONGLONG)tv.tv_sec * (LONGLONG)tccSecondsToMicroSeconds + (LONGLONG)tv.tv_usec;
    }
#endif // HAVE_CLOCK_MONOTONIC
    while (false);

    LOGEXIT("QueryPerformanceCounter\n");
    PERF_EXIT(QueryPerformanceCounter);
    return retval;
}